

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxSwitchStatement::Resolve(FxSwitchStatement *this,FCompileContext *ctx)

{
  uint *puVar1;
  BYTE BVar2;
  uint uVar3;
  FxExpression **ppFVar4;
  PString *pPVar5;
  _func_int **pp_Var6;
  long lVar7;
  CaseAddr *pCVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  FxIntCast *this_00;
  FxExpression *pFVar12;
  undefined8 uVar13;
  long *plVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  FScriptPosition *pFVar18;
  ulong uVar19;
  int iVar20;
  FString local_40;
  FScriptPosition *local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Condition != (FxExpression *)0x0) {
    iVar10 = (*this->Condition->_vptr_FxExpression[2])();
    this->Condition = (FxExpression *)CONCAT44(extraout_var,iVar10);
  }
  if (this->Condition == (FxExpression *)0x0) {
LAB_0053983f:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
LAB_00539848:
    pFVar12 = (FxExpression *)0x0;
  }
  else {
    if (this->Condition->ValueType != (PType *)TypeName) {
      this_00 = (FxIntCast *)FMemArena::Alloc(&FxAlloc,0x38);
      pFVar12 = this->Condition;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this_00->super_FxExpression).ScriptPosition,&pFVar12->ScriptPosition);
      (this_00->super_FxExpression).ValueType = (PType *)0x0;
      (this_00->super_FxExpression).isresolved = false;
      (this_00->super_FxExpression).NeedResult = true;
      (this_00->super_FxExpression).ExprType = EFX_IntCast;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxIntCast_0070f5b0;
      this_00->basex = pFVar12;
      (this_00->super_FxExpression).ValueType = (PType *)TypeSInt32;
      this_00->NoWarn = false;
      this_00->Explicit = false;
      this->Condition = (FxExpression *)this_00;
      pFVar12 = FxIntCast::Resolve(this_00,ctx);
      this->Condition = pFVar12;
      if (pFVar12 == (FxExpression *)0x0) goto LAB_0053983f;
    }
    uVar17 = (ulong)(this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
    if (uVar17 == 0) {
      pFVar18 = &(this->super_FxExpression).ScriptPosition;
      FScriptPosition::Message(pFVar18,0,"Empty switch statement");
      iVar10 = (*this->Condition->_vptr_FxExpression[3])();
      if ((char)iVar10 == '\0') {
        pp_Var6 = (this->super_FxExpression)._vptr_FxExpression;
        pFVar12 = this->Condition;
        this->Condition = (FxExpression *)0x0;
        (*pp_Var6[1])(this);
        pFVar12->NeedResult = false;
        return pFVar12;
      }
      pFVar12 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
      pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
    }
    else {
      pFVar12 = ctx->ControlStmt;
      ctx->ControlStmt = &this->super_FxExpression;
      ppFVar4 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
      lVar16 = 0;
      do {
        if (*(long **)((long)ppFVar4 + lVar16) != (long *)0x0) {
          uVar13 = (**(code **)(**(long **)((long)ppFVar4 + lVar16) + 0x10))();
          *(undefined8 *)((long)ppFVar4 + lVar16) = uVar13;
        }
        if (*(long *)((long)ppFVar4 + lVar16) == 0) {
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          goto LAB_00539848;
        }
        *(undefined1 *)(*(long *)((long)ppFVar4 + lVar16) + 0x21) = 0;
        lVar16 = lVar16 + 8;
      } while (uVar17 << 3 != lVar16);
      ctx->ControlStmt = pFVar12;
      iVar10 = (*this->Condition->_vptr_FxExpression[3])();
      if ((char)iVar10 == '\0') {
        uVar17 = (ulong)(this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count;
        if (uVar17 == 0) {
          return &this->super_FxExpression;
        }
        ppFVar4 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array;
        lVar16 = 0;
        do {
          lVar7 = *(long *)((long)ppFVar4 + lVar16);
          if ((*(int *)(lVar7 + 0x24) == 0x3d) && (*(long *)(lVar7 + 0x28) != 0)) {
            iVar10 = *(int *)(lVar7 + 0x30);
            TArray<FxSwitchStatement::CaseAddr,_FxSwitchStatement::CaseAddr>::Grow
                      (&this->CaseAddresses,1);
            pCVar8 = (this->CaseAddresses).Array;
            uVar3 = (this->CaseAddresses).Count;
            pCVar8[uVar3].casevalue = iVar10;
            pCVar8[uVar3].jumpaddress = 0;
            puVar1 = &(this->CaseAddresses).Count;
            *puVar1 = *puVar1 + 1;
          }
          lVar16 = lVar16 + 8;
        } while (uVar17 << 3 != lVar16);
        return &this->super_FxExpression;
      }
      local_38 = &(this->super_FxExpression).ScriptPosition;
      FScriptPosition::Message(local_38,0,"Case expression is constant");
      bVar9 = true;
      if ((this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count == 0) {
        iVar15 = -1;
        iVar10 = -1;
        iVar11 = -1;
        iVar20 = -1;
      }
      else {
        uVar19 = 0xffffffff;
        uVar17 = 0;
        iVar10 = -1;
        iVar15 = -1;
        do {
          pFVar12 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar17];
          if (pFVar12 != (FxExpression *)0x0) {
            if (pFVar12->ExprType == EFX_CaseStatement) {
              if (pFVar12[1]._vptr_FxExpression == (_func_int **)0x0) {
                uVar19 = uVar17 & 0xffffffff;
              }
              else {
                iVar11 = *(int *)&pFVar12[1].ScriptPosition.FileName.Chars;
                pPVar5 = (PString *)this->Condition[1]._vptr_FxExpression;
                pFVar18 = &this->Condition[1].ScriptPosition;
                if (pPVar5 == TypeString) {
                  FString::AttachToOther(&local_40,&pFVar18->FileName);
                }
                else {
                  local_40.Chars = (pFVar18->FileName).Chars;
                }
                BVar2 = (pPVar5->super_PBasicType).super_PType.RegType;
                if (BVar2 == '\x01') {
                  iVar20 = (int)(double)local_40.Chars;
                }
                else {
                  iVar20 = 0;
                  if (BVar2 == '\0') {
                    iVar20 = (int)local_40.Chars;
                  }
                }
                if (pPVar5 == TypeString) {
                  FString::~FString(&local_40);
                }
                if (iVar11 == iVar20) {
                  iVar10 = (int)uVar17;
                }
              }
              iVar20 = (int)uVar19;
              pp_Var6 = pFVar12[1]._vptr_FxExpression;
              if ((pp_Var6 != (_func_int **)0x0) &&
                 ((PType *)pp_Var6[3] != this->Condition->ValueType)) {
                FScriptPosition::Message
                          ((FScriptPosition *)(pp_Var6 + 1),2,"Type mismatch in case statement");
                (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
                bVar9 = false;
                iVar11 = -1;
                goto LAB_0053996c;
              }
            }
            iVar20 = (int)uVar19;
            pFVar12 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar17];
            if ((pFVar12->ExprType == EFX_JumpStatement) &&
               (*(int *)&pFVar12[1]._vptr_FxExpression == 0x126)) {
              iVar11 = (int)uVar17;
              if (-1 < iVar15) {
                iVar11 = iVar15;
              }
              if (-1 < iVar20) {
                iVar15 = iVar11;
              }
              if (-1 < iVar10) goto LAB_00539838;
            }
          }
          iVar20 = (int)uVar19;
          uVar17 = uVar17 + 1;
        } while (uVar17 < (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Count);
        uVar17 = 0xffffffff;
LAB_00539838:
        iVar11 = (int)uVar17;
        bVar9 = true;
      }
LAB_0053996c:
      if (!bVar9) goto LAB_00539848;
      if (iVar10 < 0) {
        iVar11 = iVar15;
        iVar10 = iVar20;
      }
      if ((0 < iVar10) && (1 < iVar11 - iVar10)) {
        plVar14 = (long *)FMemArena::Alloc(&FxAlloc,0x38);
        *plVar14 = (long)&PTR__FxExpression_00711370;
        FScriptPosition::FScriptPosition((FScriptPosition *)(plVar14 + 1),local_38);
        plVar14[3] = 0;
        *(undefined2 *)(plVar14 + 4) = 0x100;
        *(undefined4 *)((long)plVar14 + 0x24) = 0x2b;
        *plVar14 = (long)&PTR__FxSequence_00711500;
        plVar14[5] = 0;
        plVar14[6] = 0;
        uVar17 = (ulong)(iVar10 + 1U);
        if ((int)(iVar10 + 1U) < iVar11) {
          do {
            pFVar12 = (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar17];
            if ((pFVar12 != (FxExpression *)0x0) && (pFVar12->ExprType != EFX_CaseStatement)) {
              TArray<FxExpression_*,_FxExpression_*>::Grow
                        ((TArray<FxExpression_*,_FxExpression_*> *)(plVar14 + 5),1);
              uVar3 = *(uint *)((long)plVar14 + 0x34);
              *(FxExpression **)(plVar14[5] + (ulong)uVar3 * 8) = pFVar12;
              *(uint *)((long)plVar14 + 0x34) = uVar3 + 1;
              pFVar12->NeedResult = false;
              (this->Content).super_TArray<FxExpression_*,_FxExpression_*>.Array[uVar17] =
                   (FxExpression *)0x0;
            }
            uVar17 = uVar17 + 1;
          } while ((int)uVar17 < iVar11);
        }
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        pFVar12 = (FxExpression *)(**(code **)(*plVar14 + 0x10))(plVar14,ctx);
        return pFVar12;
      }
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      pFVar12 = (FxExpression *)FMemArena::Alloc(&FxAlloc,0x28);
      pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      pFVar18 = local_38;
    }
    FScriptPosition::FScriptPosition(&pFVar12->ScriptPosition,pFVar18);
    pFVar12->ValueType = (PType *)0x0;
    pFVar12->ExprType = EFX_Nop;
    pFVar12->_vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711e78;
    pFVar12->isresolved = true;
    pFVar12->NeedResult = true;
  }
  return pFVar12;
}

Assistant:

FxExpression *FxSwitchStatement::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Condition, ctx);

	if (Condition->ValueType != TypeName)
	{
		Condition = new FxIntCast(Condition, false);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (Content.Size() == 0)
	{
		ScriptPosition.Message(MSG_WARNING, "Empty switch statement");
		if (Condition->isConstant())
		{
			return new FxNop(ScriptPosition);
		}
		else
		{
			// The condition may have a side effect so it should be processed (possible to-do: Analyze all nodes in there and delete if not.)
			auto x = Condition;
			Condition = nullptr;
			delete this;
			x->NeedResult = false;
			return x;
		}
	}

	auto outerctrl = ctx.ControlStmt;
	ctx.ControlStmt = this;

	for (auto &line : Content)
	{
		SAFE_RESOLVE(line, ctx);
		line->NeedResult = false;
	}
	ctx.ControlStmt = outerctrl;

	if (Condition->isConstant())
	{
		ScriptPosition.Message(MSG_WARNING, "Case expression is constant");
		auto &content = Content;
		int defaultindex = -1;
		int defaultbreak = -1;
		int caseindex = -1;
		int casebreak = -1;
		// look for a case label with a matching value
		for (unsigned i = 0; i < content.Size(); i++)
		{
			if (content[i] != nullptr)
			{
				if (content[i]->ExprType == EFX_CaseStatement)
				{
					auto casestmt = static_cast<FxCaseStatement *>(content[i]);
					if (casestmt->Condition == nullptr) defaultindex = i;
					else if (casestmt->CaseValue == static_cast<FxConstant *>(Condition)->GetValue().GetInt()) caseindex = i;
					if (casestmt->Condition && casestmt->Condition->ValueType != Condition->ValueType)
					{
						casestmt->Condition->ScriptPosition.Message(MSG_ERROR, "Type mismatch in case statement");
						delete this;
						return nullptr;
					}
				}
				if (content[i]->ExprType == EFX_JumpStatement && static_cast<FxJumpStatement *>(content[i])->Token == TK_Break)
				{
					if (defaultindex >= 0 && defaultbreak < 0) defaultbreak = i;
					if (caseindex >= 0 && casebreak < 0)
					{
						casebreak = i;
						break;	// when we find this we do not need to look any further.
					}
				}
			}
		}
		if (caseindex < 0)
		{
			caseindex = defaultindex;
			casebreak = defaultbreak;
		}
		if (caseindex > 0 && casebreak - caseindex > 1)
		{
			auto seq = new FxSequence(ScriptPosition);
			for (int i = caseindex + 1; i < casebreak; i++)
			{
				if (content[i] != nullptr && content[i]->ExprType != EFX_CaseStatement)
				{
					seq->Add(content[i]);
					content[i] = nullptr;
				}
			}
			delete this;
			return seq->Resolve(ctx);
		}
		delete this;
		return new FxNop(ScriptPosition);
	}

	int mincase = INT_MAX;
	int maxcase = INT_MIN;
	for (auto line : Content)
	{
		if (line->ExprType == EFX_CaseStatement)
		{
			auto casestmt = static_cast<FxCaseStatement *>(line);
			if (casestmt->Condition != nullptr)
			{
				CaseAddr ca = { casestmt->CaseValue, 0 };
				CaseAddresses.Push(ca);
				if (ca.casevalue < mincase) mincase = ca.casevalue;
				if (ca.casevalue > maxcase) maxcase = ca.casevalue;
			}
		}
	}
	return this;
}